

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalNinjaGenerator::WritePhonyBuild
          (cmGlobalNinjaGenerator *this,ostream *os,string *comment,cmNinjaDeps *outputs,
          cmNinjaDeps *explicitDeps,cmNinjaDeps *implicitDeps,cmNinjaDeps *orderOnlyDeps,
          cmNinjaVars *variables)

{
  allocator local_71;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,"phony",&local_71);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  WriteBuild(this,os,comment,&local_50,outputs,explicitDeps,implicitDeps,orderOnlyDeps,variables,
             &local_70,-1,(bool *)0x0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WritePhonyBuild(std::ostream& os,
                                             const std::string& comment,
                                             const cmNinjaDeps& outputs,
                                             const cmNinjaDeps& explicitDeps,
                                             const cmNinjaDeps& implicitDeps,
                                             const cmNinjaDeps& orderOnlyDeps,
                                             const cmNinjaVars& variables)
{
  this->WriteBuild(os,
                   comment,
                   "phony",
                   outputs,
                   explicitDeps,
                   implicitDeps,
                   orderOnlyDeps,
                   variables);
}